

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hpp
# Opt level: O0

void __thiscall pearce::ThreadPool::ThreadPool(ThreadPool *this,uint32_t numThreads)

{
  uint in_ESI;
  atomic<bool> *in_RDI;
  ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
  *this_00;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  uint32_t i;
  uint local_10;
  
  std::atomic<bool>::atomic(in_RDI,false);
  this_00 = (ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
             *)(in_RDI + 8);
  memset(this_00,0,0xb0);
  ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
  ::ThreadSafeQueue(this_00);
  this_01 = (vector<std::thread,_std::allocator<std::thread>_> *)(in_RDI + 0xb8);
  memset(this_01,0,0x18);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x204d39);
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(pearce::ThreadPool::*)(),pearce::ThreadPool*>
              (this_01,(type *)in_RDI,(ThreadPool **)this_00);
  }
  return;
}

Assistant:

explicit ThreadPool(const std::uint32_t numThreads)
        : m_done{false}
        , m_workQueue{}
        , m_threads{}
    {
        try {
            for (std::uint32_t i = 0u; i < numThreads; ++i) {
                m_threads.emplace_back(&ThreadPool::worker, this);
            }
        }
        catch (...) {
            destroy();
            throw;
        }
    }